

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::SetColumnOffset(int column_index,float offset)

{
  ImGuiWindow *pIVar1;
  bool bVar2;
  ImGuiContext *pIVar3;
  ImGuiContext *g;
  uint uVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  
  while( true ) {
    pIVar3 = GImGui;
    pIVar1 = GImGui->CurrentWindow;
    pIVar1->Accessed = true;
    if (column_index < 0) {
      column_index = (pIVar1->DC).ColumnsCurrent;
    }
    if ((pIVar1->DC).ColumnsData.Size <= column_index) {
      __assert_fail("column_index < window->DC.ColumnsData.Size",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/sienkiewiczkm[P]arealights/dependencies/imgui/imgui.cpp"
                    ,0x277b,"void ImGui::SetColumnOffset(int, float)");
    }
    uVar4 = (pIVar1->DC).ColumnsFlags;
    if (((uVar4 & 4) == 0) && (column_index < (pIVar1->DC).ColumnsCount + -1)) {
      fVar5 = GetColumnWidth(column_index);
      uVar4 = (pIVar1->DC).ColumnsFlags;
      bVar2 = true;
    }
    else {
      fVar5 = 0.0;
      bVar2 = false;
    }
    fVar7 = (pIVar1->DC).ColumnsMaxX;
    if (((uVar4 & 8) == 0) &&
       (fVar6 = fVar7 - (float)((pIVar1->DC).ColumnsCount - column_index) *
                        (pIVar3->Style).ColumnsMinSpacing, fVar6 <= offset)) {
      offset = fVar6;
    }
    fVar6 = (pIVar1->DC).ColumnsMinX;
    fVar7 = (offset - fVar6) / (fVar7 - fVar6);
    ImGuiStorage::SetFloat((pIVar1->DC).StateStorage,(pIVar1->DC).ColumnsSetId + column_index,fVar7)
    ;
    if ((pIVar1->DC).ColumnsData.Size <= column_index) break;
    (pIVar1->DC).ColumnsData.Data[column_index].OffsetNorm = fVar7;
    if (!bVar2) {
      return;
    }
    column_index = column_index + 1;
    fVar7 = (pIVar3->Style).ColumnsMinSpacing;
    uVar4 = -(uint)(fVar5 <= fVar7);
    offset = offset + (float)(~uVar4 & (uint)fVar5 | (uint)fVar7 & uVar4);
  }
  __assert_fail("i < Size",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/sienkiewiczkm[P]arealights/dependencies/imgui/imgui.h"
                ,0x38b,
                "value_type &ImVector<ImGuiColumnData>::operator[](int) [T = ImGuiColumnData]");
}

Assistant:

void ImGui::SetColumnOffset(int column_index, float offset)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = GetCurrentWindow();
    if (column_index < 0)
        column_index = window->DC.ColumnsCurrent;

    IM_ASSERT(column_index < window->DC.ColumnsData.Size);

    const bool preserve_width = !(window->DC.ColumnsFlags & ImGuiColumnsFlags_NoPreserveWidths) && (column_index < window->DC.ColumnsCount-1);
    const float width = preserve_width ? GetColumnWidth(column_index) : 0.0f;

    if (!(window->DC.ColumnsFlags & ImGuiColumnsFlags_NoForceWithinWindow))
        offset = ImMin(offset, window->DC.ColumnsMaxX - g.Style.ColumnsMinSpacing * (window->DC.ColumnsCount - column_index));
    const float offset_norm = PixelsToOffsetNorm(window, offset);

    const ImGuiID column_id = window->DC.ColumnsSetId + ImGuiID(column_index);
    window->DC.StateStorage->SetFloat(column_id, offset_norm);
    window->DC.ColumnsData[column_index].OffsetNorm = offset_norm;

    if (preserve_width)
        SetColumnOffset(column_index + 1, offset + ImMax(g.Style.ColumnsMinSpacing, width));
}